

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceLibrary * __thiscall slang::SourceManager::getLibraryFor(SourceManager *this,BufferID buffer)

{
  FileInfo *pFVar1;
  SourceLibrary *pSVar2;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  pFVar1 = getFileInfo<std::shared_lock<std::shared_mutex>_>(this,buffer,&local_28);
  if (pFVar1 == (FileInfo *)0x0) {
    pSVar2 = (SourceLibrary *)0x0;
  }
  else {
    pSVar2 = pFVar1->library;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return pSVar2;
}

Assistant:

const SourceLibrary* SourceManager::getLibraryFor(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info)
        return nullptr;

    return info->library;
}